

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setStarter(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,bool destroy)

{
  if ((this->freeStarter == true) &&
     (this->thestarter !=
      (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0)) {
    (*this->thestarter->_vptr_SPxStarter[1])();
  }
  this->thestarter = x;
  if (x != (SPxStarter<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)0x0) {
    (*x->_vptr_SPxStarter[5])
              (x,&(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances);
  }
  this->freeStarter = destroy;
  return;
}

Assistant:

void SPxSolverBase<R>::setStarter(SPxStarter<R>* x, const bool destroy)
{

   assert(!freeStarter || thestarter != nullptr);

   if(freeStarter)
   {
      delete thestarter;
      thestarter = nullptr;
   }

   thestarter = x;

   if(thestarter != nullptr)
      thestarter->setTolerances(this->tolerances());

   freeStarter = destroy;
}